

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparspak.cpp
# Opt level: O1

int mmdnum_(int *neqns,int *perm,int *invp,int *qsize)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar7;
  int *piVar8;
  int iVar9;
  ulong uVar6;
  
  iVar1 = *neqns;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      if (qsize[lVar7] < 1) {
        perm[lVar7] = invp[lVar7];
      }
      else {
        perm[lVar7] = -invp[lVar7];
      }
      lVar7 = lVar7 + 1;
    } while ((int)lVar7 < iVar1);
  }
  iVar1 = *neqns;
  if (0 < iVar1) {
    uVar4 = 1;
    do {
      iVar3 = (int)uVar4;
      uVar6 = uVar4;
      if (perm[uVar4 - 1] < 1) {
        do {
          iVar5 = (int)uVar6;
          uVar2 = perm[(long)iVar5 + -1];
          uVar6 = (ulong)-uVar2;
        } while ((int)uVar2 < 1);
        invp[uVar4 - 1] = ~uVar2;
        perm[(long)iVar5 + -1] = uVar2 + 1;
        iVar9 = perm[uVar4 - 1];
        if (iVar9 < 0) {
          piVar8 = perm + (uVar4 - 1);
          do {
            *piVar8 = -iVar5;
            piVar8 = perm + ((ulong)(uint)-iVar9 - 1);
            iVar9 = *piVar8;
          } while (iVar9 < 0);
        }
      }
      uVar4 = (ulong)(iVar3 + 1);
    } while (iVar3 < iVar1);
  }
  iVar1 = *neqns;
  if (0 < iVar1) {
    lVar7 = 0;
    do {
      iVar3 = invp[lVar7];
      invp[lVar7] = -iVar3;
      lVar7 = lVar7 + 1;
      perm[-1 - (long)iVar3] = (int)lVar7;
    } while ((int)lVar7 < iVar1);
  }
  return 0;
}

Assistant:

int mmdnum_(int* neqns, int* perm, int* invp, int* qsize)
{
    /* System generated locals */
    int i__1;

    /* Local variables */
    static int node, root, nextf, father, nqsize, num;


/* *************************************************************** */

/*         INTEGER*2  INVP(1)  , PERM(1)  , QSIZE(1) */

/* *************************************************************** */

    /* Parameter adjustments */
    --qsize; --invp; --perm;

    /* Function Body */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        nqsize = qsize[node];
        if (nqsize <= 0) {
            perm[node] = invp[node];
        }
        if (nqsize > 0) {
            perm[node] = -invp[node];
        }
/* L100: */
    }
/*        ------------------------------------------------------ */
/*        FOR EACH NODE WHICH HAS BEEN MERGED, DO THE FOLLOWING. */
/*        ------------------------------------------------------ */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        if (perm[node] > 0) {
            goto L500;
        }
/*                ----------------------------------------- */
/*                TRACE THE MERGED TREE UNTIL ONE WHICH HAS */
/*                NOT BEEN MERGED, CALL IT ROOT. */
/*                ----------------------------------------- */
        father = node;
L200:
        if (perm[father] > 0) {
            goto L300;
        }
        father = -perm[father];
        goto L200;
L300:
/*                ----------------------- */
/*                NUMBER NODE AFTER ROOT. */
/*                ----------------------- */
        root = father;
        num = perm[root] + 1;
        invp[node] = -num;
        perm[root] = num;
/*                ------------------------ */
/*                SHORTEN THE MERGED TREE. */
/*                ------------------------ */
        father = node;
L400:
        nextf = -perm[father];
        if (nextf <= 0) {
            goto L500;
        }
        perm[father] = -root;
        father = nextf;
        goto L400;
L500:
        ;
    }
/*        ---------------------- */
/*        READY TO COMPUTE PERM. */
/*        ---------------------- */
    i__1 = *neqns;
    for (node = 1; node <= i__1; ++node) {
        num = -invp[node];
        invp[node] = num;
        perm[num] = node;
/* L600: */
    }
    return 0;

}